

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

bool __thiscall Loader::eraseFlash(Loader *this,string *loaderFile)

{
  bool bVar1;
  ostream *poVar2;
  int local_d4;
  duration<long,_std::ratio<1L,_1L>_> local_d0;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [48];
  string local_40 [32];
  string *local_20;
  string *loaderFile_local;
  Loader *this_local;
  
  local_20 = loaderFile;
  loaderFile_local = (string *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Initializing FPGA...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_40,(string *)loaderFile);
  bVar1 = loadBin(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = Jtag::setFreq(this->device,1500000.0);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Erasing...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      bVar1 = setIR(this,USER1);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"0",&local_71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"",&local_99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"",&local_c1);
        bVar1 = shiftDR(this,1,(string *)local_70,(string *)local_98,(string *)local_c0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_d4 = 1;
          std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_d0,&local_d4);
          std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_d0);
          bVar1 = setIR(this,JPROGRAM);
          if (bVar1) {
            bVar1 = resetState(this);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to set JTAG frequency!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to initialize FPGA!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Loader::eraseFlash(string loaderFile) {
	cout << "Initializing FPGA..." << endl;
	if (!loadBin(loaderFile)) {
		cerr << "Failed to initialize FPGA!" << endl;
		return false;
	}

	if (!device->setFreq(1500000)) {
		cerr << "Failed to set JTAG frequency!" << endl;
		return false;
	}

	cout << "Erasing..." << endl;

	// Erase the flash
	if (!setIR(USER1))
		return false;

	if (!shiftDR(1, "0", "", ""))
		return false;

	std::this_thread::sleep_for(std::chrono::seconds(1)); // wait for erase

	if (!setIR(JPROGRAM))
		return false;

	// reset just for good measure
	if (!resetState())
		return false;

	return true;
}